

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Vta_ManUnsatCoreRemap(Vta_Man_t *p,Vec_Int_t *vCore)

{
  int iVar1;
  Vta_Obj_t *pVVar2;
  int local_24;
  int Entry;
  int i;
  Vta_Obj_t *pThis;
  Vec_Int_t *vCore_local;
  Vta_Man_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vCore), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vCore,local_24);
    pVVar2 = Vta_ManObj(p,iVar1);
    Vec_IntWriteEntry(vCore,local_24,pVVar2->iFrame << ((byte)p->nObjBits & 0x1f) | pVVar2->iObj);
  }
  return;
}

Assistant:

void Vta_ManUnsatCoreRemap( Vta_Man_t * p, Vec_Int_t * vCore )
{
    Vta_Obj_t * pThis;
    int i, Entry;
    Vec_IntForEachEntry( vCore, Entry, i )
    {
        pThis = Vta_ManObj( p, Entry );
        Entry = (pThis->iFrame << p->nObjBits) | pThis->iObj;
        Vec_IntWriteEntry( vCore, i, Entry );
    }
}